

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

void __thiscall asl::HttpMessage::readHeaders(HttpMessage *this)

{
  int iVar1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  undefined8 b;
  bool bVar3;
  String line;
  String headerName;
  String headerValue;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  local_60.field_2._space[0] = '\0';
  local_60._size = 0;
  local_60._len = 0;
  local_48.field_2._space[0] = '\0';
  local_48._size = 0;
  local_48._len = 0;
  local_90.field_2._space[0] = '\0';
  local_90._size = 0;
  local_90._len = 0;
  while( true ) {
    while( true ) {
      Socket_::readLine(&local_a8,(Socket_ *)(this->_socket->super_SmartObject)._p);
      paVar2 = &local_a8.field_2;
      if (local_a8._size != 0) {
        paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]);
      }
      String::assign(&local_90,paVar2->_space,local_a8._len);
      paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
               CONCAT71(local_90.field_2._1_7_,local_90.field_2._space[0]);
      if (local_90._size == 0) {
        paVar2 = &local_90.field_2;
      }
      if (paVar2->_space[0] == '\r') {
        paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_90.field_2._1_7_,local_90.field_2._space[0]);
        if (local_90._size == 0) {
          paVar2 = &local_90.field_2;
        }
        bVar3 = paVar2->_space[1] == '\0';
      }
      else {
        bVar3 = false;
      }
      if (local_a8._size != 0) {
        free((void *)CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]));
      }
      if (bVar3) goto LAB_00123169;
      paVar2 = &local_90.field_2;
      if (local_90._size != 0) {
        paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_90.field_2._1_7_,local_90.field_2._space[0]);
      }
      iVar1 = isspace((int)paVar2->_space[0]);
      if (iVar1 == 0) break;
      String::trimmed(&local_78,&local_90);
      b = &local_78.field_2;
      if (local_78._size != 0) {
        b = local_78.field_2._str;
      }
      String::concat(&local_a8,&local_48,(char *)b,local_78._len);
      setHeader(this,&local_60,&local_a8);
      if (local_a8._size != 0) {
        free((void *)CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]));
      }
      if (local_78._size != 0) {
        free(local_78.field_2._str);
      }
    }
    String::trim(&local_90);
    iVar1 = String::indexOf(&local_90,':',0);
    if (iVar1 < 0) break;
    String::substring(&local_a8,&local_90,0,iVar1);
    paVar2 = &local_a8.field_2;
    if (local_a8._size != 0) {
      paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
               CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]);
    }
    String::assign(&local_60,paVar2->_space,local_a8._len);
    if (local_a8._size != 0) {
      free((void *)CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]));
    }
    if (iVar1 < local_90._len + -1) {
      String::substring(&local_a8,&local_90,iVar1 + 2,local_90._len);
      paVar2 = &local_a8.field_2;
      if (local_a8._size != 0) {
        paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]);
      }
      iVar1 = local_a8._len;
    }
    else {
      local_a8.field_2._space[0] = '\0';
      local_a8._size = 0;
      local_a8._len = 0;
      iVar1 = 0;
      paVar2 = &local_a8.field_2;
    }
    String::assign(&local_48,paVar2->_space,iVar1);
    if (local_a8._size != 0) {
      free((void *)CONCAT71(local_a8.field_2._1_7_,local_a8.field_2._space[0]));
    }
    setHeader(this,&local_60,&local_48);
  }
  (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
LAB_00123169:
  if (local_90._size != 0) {
    free((void *)CONCAT71(local_90.field_2._1_7_,local_90.field_2._space[0]));
  }
  if (local_48._size != 0) {
    free((void *)CONCAT71(local_48.field_2._1_7_,local_48.field_2._space[0]));
  }
  if (local_60._size != 0) {
    free((void *)CONCAT71(local_60.field_2._1_7_,local_60.field_2._space[0]));
  }
  return;
}

Assistant:

void HttpMessage::readHeaders()
{
	String headerName, headerValue, line;

	while (line = _socket->readLine(), line != "\r")
	{
		if (isspace(line[0])) // multiline
		{
			setHeader(headerName, headerValue + line.trimmed());
			continue;
		}
		line.trim();
		int i = line.indexOf(':');
		if (i<0) {
			_socket->close();
			return;
		}
		headerName = line.substring(0, i);
		headerValue = (i < line.length() - 1) ? line.substring(i + 2) : String();
		setHeader(headerName, headerValue);
	}
}